

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrMesh.cpp
# Opt level: O1

void __thiscall amrex::AmrMesh::AmrMesh(AmrMesh *this,Geometry *level_0_geom,AmrInfo *amr_info)

{
  Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *this_00;
  pointer *ppGVar1;
  int iVar2;
  iterator iVar3;
  pointer pIVar4;
  size_type __new_size;
  long lVar5;
  long lVar6;
  long lVar7;
  AmrInfo def_amr_info;
  Geometry r;
  AmrInfo local_188;
  Geometry local_f8;
  
  AmrInfo::AmrInfo(&this->super_AmrInfo,amr_info);
  this->_vptr_AmrMesh = (_func_int **)&PTR__AmrMesh_00750a38;
  this_00 = &this->geom;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
  super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dmap).super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>
  .super__Vector_base<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>.
  super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_setdm = 0;
  this->num_setba = 0;
  iVar2 = (this->super_AmrInfo).max_level;
  AmrInfo::AmrInfo(&local_188);
  __new_size = (long)iVar2 + 1;
  pIVar4 = (amr_info->ref_ratio).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->ref_ratio).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar4) {
    pIVar4 = local_188.ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).ref_ratio.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar4 + -1);
  pIVar4 = (amr_info->blocking_factor).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
           .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->blocking_factor).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar4) {
    pIVar4 = local_188.blocking_factor.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>
             .super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).blocking_factor.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar4 + -1);
  pIVar4 = (amr_info->max_grid_size).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->max_grid_size).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar4) {
    pIVar4 = local_188.max_grid_size.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).max_grid_size.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar4 + -1);
  pIVar4 = (amr_info->n_error_buf).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
           super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((amr_info->n_error_buf).super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start == pIVar4) {
    pIVar4 = local_188.n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  std::vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::resize
            (&(this->super_AmrInfo).n_error_buf.
              super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>,__new_size,pIVar4 + -1);
  std::vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>::resize
            (&(this->dmap).
              super_vector<amrex::DistributionMapping,_std::allocator<amrex::DistributionMapping>_>,
             __new_size);
  std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
            (&(this->grids).super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>,
             __new_size);
  std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::reserve
            (&this_00->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,__new_size);
  iVar3._M_current =
       (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
      super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<amrex::Geometry,std::allocator<amrex::Geometry>>::
    _M_realloc_insert<amrex::Geometry_const&>
              ((vector<amrex::Geometry,std::allocator<amrex::Geometry>> *)this_00,iVar3,level_0_geom
              );
  }
  else {
    memcpy(iVar3._M_current,level_0_geom,200);
    ppGVar1 = &(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
               super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppGVar1 = *ppGVar1 + 1;
  }
  if (0 < (this->super_AmrInfo).max_level) {
    lVar5 = 0;
    lVar6 = 0;
    lVar7 = 0;
    do {
      pIVar4 = (this->super_AmrInfo).ref_ratio.
               super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
               super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
               super__Vector_impl_data._M_start;
      memcpy(&local_f8,
             (void *)((long)(((this->geom).
                              super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                              _M_impl.super__Vector_impl_data._M_start)->super_CoordSys).offset +
                     lVar6 + 0xfffffffffffffff8U),200);
      Geometry::refine(&local_f8,(IntVect *)((long)pIVar4->vect + lVar5));
      iVar3._M_current =
           (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
           super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
          super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::
        _M_realloc_insert<amrex::Geometry>
                  (&this_00->super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,iVar3,
                   &local_f8);
      }
      else {
        memcpy(iVar3._M_current,&local_f8,200);
        ppGVar1 = &(this->geom).super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                   super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl.
                   super__Vector_impl_data._M_finish;
        *ppGVar1 = *ppGVar1 + 1;
      }
      lVar7 = lVar7 + 1;
      lVar6 = lVar6 + 200;
      lVar5 = lVar5 + 0xc;
    } while (lVar7 < (this->super_AmrInfo).max_level);
  }
  *(undefined4 *)&(this->super_AmrInfo).field_0x8c = 0xffffffff;
  if ((this->super_AmrInfo).check_input != false) {
    checkInput(this);
  }
  if (local_188.n_error_buf.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.n_error_buf.
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.n_error_buf.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.n_error_buf.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.max_grid_size.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.max_grid_size.
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.max_grid_size.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.max_grid_size.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.blocking_factor.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.blocking_factor.
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.blocking_factor.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.blocking_factor.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_188.ref_ratio.super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
      super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_188.ref_ratio.
                    super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                    super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_188.ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_188.ref_ratio.
                          super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

AmrMesh::AmrMesh (Geometry const& level_0_geom, AmrInfo const& amr_info)
    : AmrInfo(amr_info)
{
    int nlev = max_level + 1;
    AmrInfo def_amr_info;
    ref_ratio.resize      (nlev, amr_info.ref_ratio.empty()
                           ? def_amr_info.ref_ratio.back()
                           :     amr_info.ref_ratio.back());
    blocking_factor.resize(nlev, amr_info.blocking_factor.empty()
                           ? def_amr_info.blocking_factor.back()
                           :     amr_info.blocking_factor.back());
    max_grid_size.resize  (nlev, amr_info.max_grid_size.empty()
                           ? def_amr_info.max_grid_size.back()
                           :     amr_info.max_grid_size.back());
    n_error_buf.resize    (nlev, amr_info.n_error_buf.empty()
                           ? def_amr_info.n_error_buf.back()
                           :     amr_info.n_error_buf.back());

    dmap.resize(nlev);
    grids.resize(nlev);
    geom.reserve(nlev);
    geom.push_back(level_0_geom);
    for (int lev = 1; lev <= max_level; ++lev) {
        geom.push_back(amrex::refine(geom[lev-1], ref_ratio[lev-1]));
    }

    finest_level = -1;

    if (check_input) checkInput();
}